

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringWriter.cpp
# Opt level: O2

void __thiscall
ApprovalTests::StringWriter::StringWriter
          (StringWriter *this,string *contents,string *fileExtensionWithDot)

{
  (this->super_ApprovalWriter)._vptr_ApprovalWriter = (_func_int **)&PTR__StringWriter_0016acf0;
  ::std::__cxx11::string::string((string *)&this->s,(string *)contents);
  ::std::__cxx11::string::string((string *)&this->ext,(string *)fileExtensionWithDot);
  return;
}

Assistant:

StringWriter::StringWriter(std::string contents, std::string fileExtensionWithDot)
        : s(std::move(contents)), ext(std::move(fileExtensionWithDot))
    {
    }